

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O0

FT_UInt cff_get_name_index(CFF_Face face,FT_String *glyph_name)

{
  ushort uVar1;
  CFF_Font_conflict font;
  int iVar2;
  FT_Module module_00;
  FT_Pointer pvVar3;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Service_GlyphDict service;
  FT_Module sfnt_module;
  FT_Library library;
  FT_UInt i;
  FT_UShort sid;
  FT_String *name;
  FT_Service_PsCMaps psnames;
  CFF_Charset charset;
  CFF_Font_conflict cff;
  FT_String *glyph_name_local;
  CFF_Face face_local;
  
  font = (CFF_Font_conflict)(face->extra).data;
  if (font->version_major == '\x02') {
    module_00 = FT_Get_Module((((face->root).driver)->root).library,"sfnt");
    pvVar3 = ft_module_get_service(module_00,"glyph-dict",'\0');
    if ((pvVar3 == (FT_Pointer)0x0) || (*(long *)((long)pvVar3 + 8) == 0)) {
      face_local._4_4_ = 0;
    }
    else {
      face_local._4_4_ = (**(code **)((long)pvVar3 + 8))(face,glyph_name);
    }
  }
  else {
    pvVar3 = ft_module_get_service(&((face->root).driver)->root,"postscript-cmaps",'\x01');
    if (pvVar3 == (FT_Pointer)0x0) {
      face_local._4_4_ = 0;
    }
    else {
      for (library._0_4_ = 0; (uint)library < font->num_glyphs; library._0_4_ = (uint)library + 1) {
        uVar1 = (font->charset).sids[(uint)library];
        if (uVar1 < 0x187) {
          _i = (FT_String *)(**(code **)((long)pvVar3 + 0x28))(uVar1);
        }
        else {
          _i = cff_index_get_string(font,uVar1 - 0x187);
        }
        if ((_i != (char *)0x0) && (iVar2 = strcmp(glyph_name,_i), iVar2 == 0)) {
          return (uint)library;
        }
      }
      face_local._4_4_ = 0;
    }
  }
  return face_local._4_4_;
}

Assistant:

static FT_UInt
  cff_get_name_index( CFF_Face          face,
                      const FT_String*  glyph_name )
  {
    CFF_Font            cff;
    CFF_Charset         charset;
    FT_Service_PsCMaps  psnames;
    FT_String*          name;
    FT_UShort           sid;
    FT_UInt             i;


    cff     = (CFF_FontRec *)face->extra.data;
    charset = &cff->charset;

    /* CFF2 table does not have glyph names; */
    /* we need to use `post' table method    */
    if ( cff->version_major == 2 )
    {
      FT_Library            library     = FT_FACE_LIBRARY( face );
      FT_Module             sfnt_module = FT_Get_Module( library, "sfnt" );
      FT_Service_GlyphDict  service     =
        (FT_Service_GlyphDict)ft_module_get_service(
                                 sfnt_module,
                                 FT_SERVICE_ID_GLYPH_DICT,
                                 0 );


      if ( service && service->name_index )
        return service->name_index( FT_FACE( face ), glyph_name );
      else
      {
        FT_ERROR(( "cff_get_name_index:"
                   " cannot get glyph index from a CFF2 font\n" ));
        FT_ERROR(( "                   "
                   " without the `psnames' module\n" ));
        return 0;
      }
    }

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    if ( !psnames )
      return 0;

    for ( i = 0; i < cff->num_glyphs; i++ )
    {
      sid = charset->sids[i];

      if ( sid > 390 )
        name = cff_index_get_string( cff, sid - 391 );
      else
        name = (FT_String *)psnames->adobe_std_strings( sid );

      if ( !name )
        continue;

      if ( !ft_strcmp( glyph_name, name ) )
        return i;
    }

    return 0;
  }